

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Group.c
# Opt level: O3

Llb_Grp_t * Llb_ManGroupAlloc(Llb_Man_t *pMan)

{
  uint uVar1;
  int iVar2;
  Llb_Grp_t *pLVar3;
  Vec_Ptr_t *pVVar4;
  void **ppvVar5;
  
  pLVar3 = (Llb_Grp_t *)calloc(1,0x38);
  pLVar3->pMan = pMan;
  pVVar4 = (Vec_Ptr_t *)malloc(0x10);
  pVVar4->nCap = 8;
  pVVar4->nSize = 0;
  ppvVar5 = (void **)malloc(0x40);
  pVVar4->pArray = ppvVar5;
  pLVar3->vIns = pVVar4;
  pVVar4 = (Vec_Ptr_t *)malloc(0x10);
  pVVar4->nCap = 8;
  pVVar4->nSize = 0;
  ppvVar5 = (void **)malloc(0x40);
  pVVar4->pArray = ppvVar5;
  pLVar3->vOuts = pVVar4;
  pVVar4 = pMan->vGroups;
  uVar1 = pVVar4->nSize;
  pLVar3->Id = uVar1;
  if (uVar1 == pVVar4->nCap) {
    if ((int)uVar1 < 0x10) {
      if (pVVar4->pArray == (void **)0x0) {
        ppvVar5 = (void **)malloc(0x80);
      }
      else {
        ppvVar5 = (void **)realloc(pVVar4->pArray,0x80);
      }
      pVVar4->pArray = ppvVar5;
      pVVar4->nCap = 0x10;
    }
    else {
      if (pVVar4->pArray == (void **)0x0) {
        ppvVar5 = (void **)malloc((ulong)uVar1 << 4);
      }
      else {
        ppvVar5 = (void **)realloc(pVVar4->pArray,(ulong)uVar1 << 4);
      }
      pVVar4->pArray = ppvVar5;
      pVVar4->nCap = uVar1 * 2;
    }
  }
  else {
    ppvVar5 = pVVar4->pArray;
  }
  iVar2 = pVVar4->nSize;
  pVVar4->nSize = iVar2 + 1;
  ppvVar5[iVar2] = pLVar3;
  return pLVar3;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Llb_Grp_t * Llb_ManGroupAlloc( Llb_Man_t * pMan )
{
    Llb_Grp_t * p;
    p = ABC_CALLOC( Llb_Grp_t, 1 );
    p->pMan   = pMan;
    p->vIns   = Vec_PtrAlloc( 8 );
    p->vOuts  = Vec_PtrAlloc( 8 );
    p->Id     = Vec_PtrSize( pMan->vGroups );
    Vec_PtrPush( pMan->vGroups, p );
    return p;
}